

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cheaptrick.cpp
# Opt level: O1

void CheapTrick(double *x,int x_length,int fs,double *temporal_positions,double *f0,int f0_length,
               CheapTrickOption *option,double **spectrogram)

{
  bool bVar1;
  double dVar2;
  double f0_00;
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  fft_plan p_02;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  void *pvVar8;
  double dVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  undefined8 *puVar13;
  double *pdVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  double *pdVar19;
  ulong uVar20;
  long lVar21;
  fft_plan *pfVar22;
  ulong uVar23;
  undefined8 *puVar24;
  ulong uVar25;
  int i;
  void *__x;
  double *pdVar26;
  double *pdVar27;
  byte bVar28;
  ulong uVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  RandnState randn_state;
  ForwardRealFFT forward_real_fft;
  InverseRealFFT inverse_real_fft;
  undefined8 auStackY_228 [5];
  undefined1 in_stack_fffffffffffffe00 [32];
  undefined4 uVar36;
  RandnState local_108;
  ForwardRealFFT local_f8;
  InverseRealFFT local_98;
  
  bVar28 = 0;
  uVar17 = option->fft_size;
  local_108.g_randn_x = 0;
  local_108.g_randn_y = 0;
  local_108.g_randn_z = 0;
  local_108.g_randn_w = 0;
  randn_reseed(&local_108);
  uVar23 = (long)(int)uVar17 * 8;
  if ((long)(int)uVar17 < 0) {
    uVar23 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar23);
  local_f8.forward_fft.ip = (int *)0x0;
  local_f8.forward_fft.w = (double *)0x0;
  local_f8.forward_fft.out = (double *)0x0;
  local_f8.forward_fft.input = (double *)0x0;
  local_f8.forward_fft.in = (double *)0x0;
  local_f8.forward_fft.c_out = (fft_complex *)0x0;
  local_f8.forward_fft.flags = 0;
  local_f8.forward_fft._12_4_ = 0;
  local_f8.forward_fft.c_in = (fft_complex *)0x0;
  local_f8.spectrum = (fft_complex *)0x0;
  local_f8.forward_fft.n = 0;
  local_f8.forward_fft.sign = 0;
  local_f8.fft_size = 0;
  local_f8._4_4_ = 0;
  local_f8.waveform = (double *)0x0;
  InitializeForwardRealFFT(uVar17,&local_f8);
  local_98.inverse_fft.ip = (int *)0x0;
  local_98.inverse_fft.w = (double *)0x0;
  local_98.inverse_fft.out = (double *)0x0;
  local_98.inverse_fft.input = (double *)0x0;
  local_98.inverse_fft.in = (double *)0x0;
  local_98.inverse_fft.c_out = (fft_complex *)0x0;
  local_98.inverse_fft.flags = 0;
  local_98.inverse_fft._12_4_ = 0;
  local_98.inverse_fft.c_in = (fft_complex *)0x0;
  local_98.spectrum = (fft_complex *)0x0;
  local_98.inverse_fft.n = 0;
  local_98.inverse_fft.sign = 0;
  local_98.fft_size = 0;
  local_98._4_4_ = 0;
  local_98.waveform = (double *)0x0;
  InitializeInverseRealFFT(uVar17,&local_98);
  if (0 < f0_length) {
    uVar18 = (ulong)uVar17;
    dVar30 = (double)fs;
    dVar35 = (double)(int)uVar17;
    iVar3 = uVar17 - 2;
    uVar4 = (int)uVar17 / 2;
    pdVar26 = (double *)(ulong)(uVar4 + 1);
    uVar15 = 2;
    if (2 < (int)uVar4) {
      uVar15 = (ulong)uVar4;
    }
    uVar36 = 0;
    uVar20 = 0;
    do {
      uVar29 = -(ulong)((dVar30 * 3.0) / (dVar35 + -3.0) < f0[uVar20]);
      f0_00 = (double)(~uVar29 & 0x407f400000000000 | (ulong)f0[uVar20] & uVar29);
      dVar34 = temporal_positions[uVar20];
      dVar33 = option->q1;
      dVar2 = (dVar30 * 1.5) / f0_00;
      uVar4 = matlab_round(dVar2);
      __x = (void *)(ulong)uVar4;
      dVar9 = (double)(ulong)(uVar4 * 2);
      uVar5 = uVar4 * 2 + 1;
      uVar29 = (long)(int)uVar5 * 4;
      uVar25 = (long)(int)uVar5 << 3;
      if ((int)uVar4 < 0) {
        uVar29 = 0xffffffffffffffff;
        uVar25 = 0xffffffffffffffff;
      }
      pvVar10 = operator_new__(uVar29);
      pvVar11 = operator_new__(uVar29);
      pvVar12 = operator_new__(uVar25);
      if (-1 < (int)uVar4) {
        lVar21 = 0;
        do {
          *(uint *)((long)pvVar10 + lVar21 * 4 + (ulong)uVar4 * 4 + (long)(int)uVar4 * -4) =
               (int)lVar21 - uVar4;
          lVar21 = lVar21 + 1;
        } while (SUB84(dVar9,0) + 1 != (int)lVar21);
      }
      iVar6 = matlab_round(dVar34 * dVar30 + 0.001);
      if ((int)uVar4 < 0) {
        dVar31 = 0.0;
      }
      else {
        uVar4 = 0;
        if (0 < (int)SUB84(dVar9,0)) {
          uVar4 = SUB84(dVar9,0);
        }
        uVar29 = 0;
        do {
          iVar16 = *(int *)((long)pvVar10 + uVar29 * 4) + iVar6;
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          if (x_length + -1 < iVar16) {
            iVar16 = x_length + -1;
          }
          *(int *)((long)pvVar11 + uVar29 * 4) = iVar16;
          uVar29 = uVar29 + 1;
        } while ((uVar4 | 1) != uVar29);
        dVar31 = 0.0;
        uVar29 = 0;
        do {
          dVar34 = dVar31;
          dVar31 = cos((((double)*(int *)((long)pvVar10 + uVar29 * 4) / 1.5) / dVar30) *
                       3.141592653589793 * f0_00);
          dVar31 = dVar31 * 0.5 + 0.5;
          *(double *)((long)pvVar12 + uVar29 * 8) = dVar31;
          dVar31 = dVar34 + dVar31 * dVar31;
          uVar29 = uVar29 + 1;
        } while ((uVar4 | 1) != uVar29);
      }
      if (dVar31 < 0.0) {
        dVar31 = sqrt(dVar31);
        uVar4 = uVar17;
      }
      else {
        dVar31 = SQRT(dVar31);
        uVar4 = uVar17;
      }
      pdVar27 = local_f8.waveform;
      uVar17 = SUB84(dVar9,0);
      if (-1 < (int)__x) {
        uVar7 = 0;
        if (0 < (int)uVar17) {
          uVar7 = uVar17;
        }
        uVar29 = 0;
        do {
          *(double *)((long)pvVar12 + uVar29 * 8) = *(double *)((long)pvVar12 + uVar29 * 8) / dVar31
          ;
          uVar29 = uVar29 + 1;
        } while ((uVar7 | 1) != uVar29);
      }
      dVar31 = NAN;
      if (-1 < (int)uVar17) {
        uVar29 = (ulong)dVar9 & 0xffffffff;
        lVar21 = 0;
        do {
          dVar34 = x[*(int *)((long)pvVar11 + lVar21 * 4)] * *(double *)((long)pvVar12 + lVar21 * 8)
          ;
          dVar31 = randn(&local_108);
          pdVar27[lVar21] = dVar31 * 1e-12 + dVar34;
          lVar21 = lVar21 + 1;
        } while (uVar29 + 1 != lVar21);
        dVar32 = 0.0;
        lVar21 = 0;
        dVar31 = 0.0;
        do {
          dVar31 = dVar31 + pdVar27[lVar21];
          dVar32 = dVar32 + *(double *)((long)pvVar12 + lVar21 * 8);
          lVar21 = lVar21 + 1;
        } while (uVar29 + 1 != lVar21);
        dVar31 = dVar31 / dVar32;
        uVar17 = SUB84(dVar9,0);
        __x = pvVar12;
      }
      if (-1 < (int)uVar17) {
        uVar29 = 0;
        do {
          pdVar27[uVar29] = pdVar27[uVar29] - *(double *)((long)pvVar12 + uVar29 * 8) * dVar31;
          uVar29 = uVar29 + 1;
        } while (uVar5 != uVar29);
      }
      pdVar27 = pdVar26;
      operator_delete__(pvVar10);
      operator_delete__(pvVar11);
      operator_delete__(pvVar12);
      iVar6 = matlab_round(dVar2);
      if (iVar6 * 2 + 1 < (int)uVar4) {
        memset(local_f8.waveform + (long)(iVar6 * 2) + 1,0,(ulong)(uint)(iVar3 + iVar6 * -2) * 8 + 8
              );
      }
      pfVar22 = &local_f8.forward_fft;
      puVar13 = auStackY_228;
      for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
        *puVar13 = *(undefined8 *)pfVar22;
        pfVar22 = (fft_plan *)((long)pfVar22 + ((ulong)bVar28 * -2 + 1) * 8);
        puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      }
      p.c_out = (fft_complex *)dVar34;
      p.n = in_stack_fffffffffffffe00._0_4_;
      p.sign = in_stack_fffffffffffffe00._4_4_;
      p.flags = in_stack_fffffffffffffe00._8_4_;
      p._12_4_ = in_stack_fffffffffffffe00._12_4_;
      p.c_in = (fft_complex *)in_stack_fffffffffffffe00._16_8_;
      p.in = (double *)in_stack_fffffffffffffe00._24_8_;
      p.out._0_4_ = uVar4;
      p.out._4_4_ = uVar36;
      p.input = (double *)dVar9;
      p.ip = (int *)__x;
      p.w = pdVar27;
      fft_execute(p);
      if (-2 < (int)uVar4) {
        pdVar14 = *local_f8.spectrum + 1;
        pdVar19 = (double *)0x0;
        do {
          local_f8.waveform[(long)pdVar19] =
               (*(fft_complex *)(pdVar14 + -1))[0] * (*(fft_complex *)(pdVar14 + -1))[0] +
               *pdVar14 * *pdVar14;
          pdVar19 = (double *)((long)pdVar19 + 1);
          pdVar14 = pdVar14 + 2;
        } while (pdVar26 != pdVar19);
      }
      uVar17 = uVar4;
      DCCorrection(local_f8.waveform,f0_00,fs,uVar4,local_f8.waveform);
      LinearSmoothing(local_f8.waveform,(f0_00 + f0_00) / 3.0,fs,uVar4,local_f8.waveform);
      pdVar14 = local_f8.waveform;
      if (-2 < (int)uVar4) {
        pdVar19 = (double *)0x0;
        do {
          dVar34 = pdVar14[(long)pdVar19];
          dVar2 = randn(&local_108);
          pdVar14[(long)pdVar19] = ABS(dVar2) * 2.220446049250313e-16 + dVar34;
          pdVar19 = (double *)((long)pdVar19 + 1);
        } while (pdVar26 != pdVar19);
      }
      puVar13 = (undefined8 *)operator_new__(uVar23);
      pdVar14 = (double *)operator_new__(uVar23);
      *puVar13 = 0x3ff0000000000000;
      dVar33 = dVar33 + dVar33;
      *pdVar14 = dVar33 + (1.0 - dVar33);
      if (1 < local_f8.fft_size) {
        lVar21 = 1;
        dVar9 = 1.0 - dVar33;
        do {
          dVar34 = (double)(int)lVar21 / dVar30;
          __x = (void *)(f0_00 * 3.141592653589793 * dVar34);
          dVar2 = sin((double)__x);
          puVar13[lVar21] = dVar2 / (double)__x;
          dVar2 = cos(dVar34 * 6.283185307179586 * f0_00);
          pdVar14[lVar21] = dVar2 * dVar33 + dVar9;
          bVar1 = lVar21 < local_f8.fft_size / 2;
          lVar21 = lVar21 + 1;
        } while (bVar1);
      }
      pdVar19 = pdVar27;
      if (-2 < (int)uVar17) {
        pdVar26 = (double *)0x0;
        do {
          dVar33 = log(local_f8.waveform[(long)pdVar26]);
          local_f8.waveform[(long)pdVar26] = dVar33;
          pdVar26 = (double *)((long)pdVar26 + 1);
        } while (pdVar27 != pdVar26);
      }
      if (3 < (int)uVar17) {
        pdVar26 = local_f8.waveform + (uVar18 - 1);
        uVar29 = 1;
        do {
          *pdVar26 = local_f8.waveform[uVar29];
          uVar29 = uVar29 + 1;
          pdVar26 = pdVar26 + -1;
        } while (uVar15 != uVar29);
      }
      pfVar22 = &local_f8.forward_fft;
      puVar24 = auStackY_228;
      for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
        *puVar24 = *(undefined8 *)pfVar22;
        pfVar22 = (fft_plan *)((long)pfVar22 + ((ulong)bVar28 * -2 + 1) * 8);
        puVar24 = puVar24 + (ulong)bVar28 * -2 + 1;
      }
      p_00.c_out = (fft_complex *)dVar34;
      p_00.n = in_stack_fffffffffffffe00._0_4_;
      p_00.sign = in_stack_fffffffffffffe00._4_4_;
      p_00.flags = in_stack_fffffffffffffe00._8_4_;
      p_00._12_4_ = in_stack_fffffffffffffe00._12_4_;
      p_00.c_in = (fft_complex *)in_stack_fffffffffffffe00._16_8_;
      p_00.in = (double *)in_stack_fffffffffffffe00._24_8_;
      p_00.out._0_4_ = uVar17;
      p_00.out._4_4_ = uVar36;
      p_00.input = (double *)dVar9;
      p_00.ip = (int *)__x;
      p_00.w = pdVar19;
      fft_execute(p_00);
      if ((int)uVar17 < -1) {
        pfVar22 = &local_98.inverse_fft;
        puVar24 = auStackY_228;
        for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
          *puVar24 = *(undefined8 *)pfVar22;
          pfVar22 = (fft_plan *)((long)pfVar22 + ((ulong)bVar28 * -2 + 1) * 8);
          puVar24 = puVar24 + (ulong)bVar28 * -2 + 1;
        }
        p_01.c_out = (fft_complex *)dVar34;
        p_01.n = in_stack_fffffffffffffe00._0_4_;
        p_01.sign = in_stack_fffffffffffffe00._4_4_;
        p_01.flags = in_stack_fffffffffffffe00._8_4_;
        p_01._12_4_ = in_stack_fffffffffffffe00._12_4_;
        p_01.c_in = (fft_complex *)in_stack_fffffffffffffe00._16_8_;
        p_01.in = (double *)in_stack_fffffffffffffe00._24_8_;
        p_01.out._0_4_ = uVar17;
        p_01.out._4_4_ = uVar36;
        p_01.input = (double *)dVar9;
        p_01.ip = (int *)__x;
        p_01.w = pdVar19;
        fft_execute(p_01);
        pdVar26 = pdVar19;
      }
      else {
        lVar21 = 0;
        pdVar26 = pdVar19;
        do {
          *(double *)((long)*local_98.spectrum + lVar21 * 2) =
               (*(double *)((long)*local_f8.spectrum + lVar21 * 2) *
                *(double *)((long)puVar13 + lVar21) * *(double *)((long)pdVar14 + lVar21)) / dVar35;
          *(undefined8 *)((long)*local_98.spectrum + lVar21 * 2 + 8) = 0;
          lVar21 = lVar21 + 8;
          pdVar26 = (double *)((long)pdVar26 + -1);
        } while (pdVar26 != (double *)0x0);
        pfVar22 = &local_98.inverse_fft;
        puVar24 = auStackY_228;
        for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
          *puVar24 = *(undefined8 *)pfVar22;
          pfVar22 = (fft_plan *)((long)pfVar22 + ((ulong)bVar28 * -2 + 1) * 8);
          puVar24 = puVar24 + (ulong)bVar28 * -2 + 1;
        }
        p_02.c_out = (fft_complex *)dVar34;
        p_02.n = in_stack_fffffffffffffe00._0_4_;
        p_02.sign = in_stack_fffffffffffffe00._4_4_;
        p_02.flags = in_stack_fffffffffffffe00._8_4_;
        p_02._12_4_ = in_stack_fffffffffffffe00._12_4_;
        p_02.c_in = (fft_complex *)in_stack_fffffffffffffe00._16_8_;
        p_02.in = (double *)in_stack_fffffffffffffe00._24_8_;
        p_02.out._0_4_ = uVar17;
        p_02.out._4_4_ = uVar36;
        p_02.input = (double *)dVar9;
        p_02.ip = (int *)__x;
        p_02.w = pdVar19;
        fft_execute(p_02);
        pdVar27 = (double *)0x0;
        pdVar26 = pdVar19;
        do {
          dVar33 = exp(local_98.waveform[(long)pdVar27]);
          *(double *)((long)pvVar8 + (long)pdVar27 * 8) = dVar33;
          pdVar27 = (double *)((long)pdVar27 + 1);
        } while (pdVar19 != pdVar27);
      }
      operator_delete__(puVar13);
      operator_delete__(pdVar14);
      if (-2 < (int)uVar17) {
        pdVar27 = spectrogram[uVar20];
        pdVar14 = (double *)0x0;
        do {
          pdVar27[(long)pdVar14] = *(double *)((long)pvVar8 + (long)pdVar14 * 8);
          pdVar14 = (double *)((long)pdVar14 + 1);
        } while (pdVar19 != pdVar14);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != (uint)f0_length);
  }
  DestroyForwardRealFFT(&local_f8);
  DestroyInverseRealFFT(&local_98);
  operator_delete__(pvVar8);
  return;
}

Assistant:

void CheapTrick(const double *x, int x_length, int fs,
    const double *temporal_positions, const double *f0, int f0_length,
    const CheapTrickOption *option, double **spectrogram) {
  int fft_size = option->fft_size;

  RandnState randn_state = {};
  randn_reseed(&randn_state);

  double f0_floor = GetF0FloorForCheapTrick(fs, fft_size);
  double *spectral_envelope = new double[fft_size];

  ForwardRealFFT forward_real_fft = {0};
  InitializeForwardRealFFT(fft_size, &forward_real_fft);
  InverseRealFFT inverse_real_fft = {0};
  InitializeInverseRealFFT(fft_size, &inverse_real_fft);

  double current_f0;
  for (int i = 0; i < f0_length; ++i) {
    current_f0 = f0[i] <= f0_floor ? world::kDefaultF0 : f0[i];
    CheapTrickGeneralBody(x, x_length, fs, current_f0, fft_size,
        temporal_positions[i], option->q1, &forward_real_fft,
        &inverse_real_fft, spectral_envelope, &randn_state);
    for (int j = 0; j <= fft_size / 2; ++j)
      spectrogram[i][j] = spectral_envelope[j];
  }

  DestroyForwardRealFFT(&forward_real_fft);
  DestroyInverseRealFFT(&inverse_real_fft);
  delete[] spectral_envelope;
}